

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O3

void * mslab_alloc(mempool *pool,mslab *slab)

{
  uint32_t uVar1;
  mslab *pmVar2;
  undefined8 *puVar3;
  
  if (slab->nfree != 0) {
    puVar3 = (undefined8 *)slab->free_list;
    if (puVar3 == (undefined8 *)0x0) {
      puVar3 = (undefined8 *)((long)&(slab->slab).next_in_cache.prev + (ulong)slab->free_offset);
      slab->free_offset = pool->objsize + slab->free_offset;
    }
    else {
      slab->free_list = (void *)*puVar3;
    }
    uVar1 = slab->nfree - 1;
    slab->nfree = uVar1;
    if (uVar1 == 0) {
      if (pool->first_hot_slab == slab) {
        pmVar2 = mslab_tree_next(&pool->hot_slabs,slab);
        pool->first_hot_slab = pmVar2;
      }
      mslab_tree_remove(&pool->hot_slabs,slab);
      slab->in_hot_slabs = false;
    }
    return puVar3;
  }
  __assert_fail("slab->nfree",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/mempool.c"
                ,0x44,"void *mslab_alloc(struct mempool *, struct mslab *)");
}

Assistant:

void *
mslab_alloc(struct mempool *pool, struct mslab *slab)
{
	assert(slab->nfree);
	void *result;
	if (slab->free_list) {
		/* Recycle an object from the garbage pool. */
		result = slab->free_list;
		/*
		 * In case when pool objsize is not aligned sizeof(intptr_t)
		 * boundary we can't use *(void **)slab->free_list construction,
		 * because (void **)slab->free_list has not necessary aligment.
		 * memcpy can work with misaligned address.
		 */
		memcpy(&slab->free_list, slab->free_list, sizeof(void *));
	} else {
		/* Use an object from the "untouched" area of the slab. */
		result = (char *)slab + slab->free_offset;
		slab->free_offset += pool->objsize;
	}

	/* If the slab is full, remove it from the rb tree. */
	if (--slab->nfree == 0) {
		if (slab == pool->first_hot_slab) {
			pool->first_hot_slab = mslab_tree_next(&pool->hot_slabs,
							       slab);
		}
		mslab_tree_remove(&pool->hot_slabs, slab);
		slab->in_hot_slabs = false;
	}
	return result;
}